

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

GLFWbool waitForEvent(double *timeout)

{
  uint __i;
  int iVar1;
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  int *piVar5;
  uint64_t uVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  timeval tv;
  fd_set_conflict fds;
  
  iVar2 = *(int *)(_glfw.x11.display + 0x10);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    fds.__fds_bits[lVar3] = 0;
  }
  fds.__fds_bits[iVar2 / 0x40] = fds.__fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
  fds.__fds_bits[_glfw.linux_js.inotify / 0x40] =
       fds.__fds_bits[_glfw.linux_js.inotify / 0x40] | 1L << ((byte)_glfw.linux_js.inotify & 0x3f);
  iVar7 = _glfw.linux_js.inotify;
  if (_glfw.linux_js.inotify < iVar2) {
    iVar7 = iVar2;
  }
  while( true ) {
    while (timeout == (double *)0x0) {
      iVar2 = select(iVar7 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if ((iVar2 != -1) || (piVar5 = __errno_location(), *piVar5 != 4)) {
        return 1;
      }
    }
    tv.tv_sec = (__time_t)*timeout;
    tv.tv_usec = (__suseconds_t)((*timeout - (double)tv.tv_sec) * 1000000.0);
    uVar4 = _glfwPlatformGetTimerValue();
    iVar1 = select(iVar7 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    uVar6 = _glfwPlatformGetTimerValue();
    lVar3 = uVar6 - uVar4;
    auVar9._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar9._0_8_ = lVar3;
    auVar9._12_4_ = 0x45300000;
    uVar4 = _glfwPlatformGetTimerFrequency();
    auVar10._8_4_ = (int)(uVar4 >> 0x20);
    auVar10._0_8_ = uVar4;
    auVar10._12_4_ = 0x45300000;
    dVar8 = *timeout -
            ((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
            ((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    *timeout = dVar8;
    if (0 < iVar1) {
      return 1;
    }
    if (iVar2 == 4 && iVar1 == -1) break;
    if (dVar8 <= 0.0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static GLFWbool waitForEvent(double* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);
    int count = fd + 1;

    FD_ZERO(&fds);
    FD_SET(fd, &fds);
#if defined(__linux__)
    FD_SET(_glfw.linux_js.inotify, &fds);

    if (fd < _glfw.linux_js.inotify)
        count = _glfw.linux_js.inotify + 1;
#endif
    for (;;)
    {
        if (timeout)
        {
            const long seconds = (long) *timeout;
            const long microseconds = (long) ((*timeout - seconds) * 1e6);
            struct timeval tv = { seconds, microseconds };
            const uint64_t base = _glfwPlatformGetTimerValue();

            const int result = select(count, &fds, NULL, NULL, &tv);
            const int error = errno;

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            if ((result == -1 && error == EINTR) || *timeout <= 0.0)
                return GLFW_FALSE;
        }
        else if (select(count, &fds, NULL, NULL, NULL) != -1 || errno != EINTR)
            return GLFW_TRUE;
    }
}